

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O2

void quad_lookup_fill_distance(quad_lookup_t quads,distance_t *distances)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  output_quad_t *poVar4;
  uint uVar5;
  uint uVar6;
  long in_stack_00000010;
  
  for (uVar3 = 1; poVar4 = (output_quad_t *)(ulong)uVar3, poVar4 < quads.outputs; uVar3 = uVar3 + 1)
  {
    uVar1 = *(uint *)(in_stack_00000010 + (long)poVar4 * 4);
    bVar2 = quads.keys._4_1_;
    uVar5 = uVar1 >> (bVar2 & 0x1f);
    uVar6 = uVar5 >> (bVar2 & 0x1f);
    *(ulong *)(quads._16_8_ + (long)poVar4 * 8) =
         (ulong)distances[(uint)quads.keys & uVar1] |
         (ulong)distances[uVar6 & (uint)quads.keys] << 0x20 |
         (ulong)distances[uVar6 >> (bVar2 & 0x1f)] << 0x30 |
         (long)(int)((uint)distances[uVar5 & (uint)quads.keys] << 0x10);
  }
  return;
}

Assistant:

void quad_lookup_fill_distance(quad_lookup_t quads, distance_t *distances) {
    for (unsigned int i = 1; i < quads.outputs_len; i += 1) {
        output_quad_t concat_out = quads.outputs[i];
        unsigned int i_0 = concat_out & quads.output_mask;
        concat_out >>= quads.output_width;
        unsigned int i_1 = concat_out & quads.output_mask;
        concat_out >>= quads.output_width;
        unsigned int i_2 = concat_out & quads.output_mask;
        concat_out >>= quads.output_width;
        unsigned int i_3 = concat_out;

        quads.distances[i] = ((uint64_t)distances[i_3] << 48) | ((uint64_t)distances[i_2] << 32) | (distances[i_1] << 16) | distances[i_0];
    }
}